

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Matchers::Impl::StdString::Equals::~Equals(Equals *this)

{
  ~Equals(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Matchers::Impl::StdString::Equals::~Equals() {}